

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreTests.cpp
# Opt level: O3

bool ContainsMacro(Preprocessor *preprocessor,string *macroIdentifier)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  __normal_iterator<const_tcpp::TMacroDesc_*,_std::vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>_>
  _Var4;
  __normal_iterator<const_tcpp::TMacroDesc_*,_std::vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>_>
  _Var5;
  TSymTable local_48;
  
  tcpp::Preprocessor::GetSymbolsTable(&local_48,preprocessor);
  lVar2 = (long)local_48.super__Vector_base<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_48.super__Vector_base<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>.
                _M_impl.super__Vector_impl_data._M_start;
  lVar3 = (lVar2 >> 3) * 0x2e8ba2e8ba2e8ba3 >> 2;
  _Var5._M_current =
       local_48.super__Vector_base<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>._M_impl.
       super__Vector_impl_data._M_start;
  if (0 < lVar3) {
    lVar2 = lVar3 + 1;
    do {
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<ContainsMacro(tcpp::Preprocessor_const&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<ContainsMacro(tcpp::Preprocessor_const&,std::__cxx11::string_const&)::__0>
                            *)macroIdentifier,_Var5);
      _Var4._M_current = _Var5._M_current;
      if (bVar1) goto LAB_00120058;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<ContainsMacro(tcpp::Preprocessor_const&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<ContainsMacro(tcpp::Preprocessor_const&,std::__cxx11::string_const&)::__0>
                            *)macroIdentifier,_Var5._M_current + 1);
      _Var4._M_current = _Var5._M_current + 1;
      if (bVar1) goto LAB_00120058;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<ContainsMacro(tcpp::Preprocessor_const&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<ContainsMacro(tcpp::Preprocessor_const&,std::__cxx11::string_const&)::__0>
                            *)macroIdentifier,_Var5._M_current + 2);
      _Var4._M_current = _Var5._M_current + 2;
      if (bVar1) goto LAB_00120058;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<ContainsMacro(tcpp::Preprocessor_const&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<ContainsMacro(tcpp::Preprocessor_const&,std::__cxx11::string_const&)::__0>
                            *)macroIdentifier,_Var5._M_current + 3);
      _Var4._M_current = _Var5._M_current + 3;
      if (bVar1) goto LAB_00120058;
      _Var5._M_current = _Var5._M_current + 4;
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
    lVar2 = (long)local_48.super__Vector_base<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(local_48.super__Vector_base<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>.
                   _M_impl.super__Vector_impl_data._M_start + lVar3 * 4);
    _Var5._M_current =
         local_48.super__Vector_base<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>._M_impl.
         super__Vector_impl_data._M_start + lVar3 * 4;
  }
  lVar2 = (lVar2 >> 3) * 0x2e8ba2e8ba2e8ba3;
  if (lVar2 != 1) {
    if (lVar2 != 2) {
      _Var4._M_current =
           local_48.super__Vector_base<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if ((lVar2 != 3) ||
         (bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<ContainsMacro(tcpp::Preprocessor_const&,std::__cxx11::string_const&)::$_0>
                  ::operator()((_Iter_pred<ContainsMacro(tcpp::Preprocessor_const&,std::__cxx11::string_const&)::__0>
                                *)macroIdentifier,_Var5), _Var4._M_current = _Var5._M_current, bVar1
         )) goto LAB_00120058;
      _Var5._M_current = _Var5._M_current + 1;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<ContainsMacro(tcpp::Preprocessor_const&,std::__cxx11::string_const&)::$_0>::
            operator()((_Iter_pred<ContainsMacro(tcpp::Preprocessor_const&,std::__cxx11::string_const&)::__0>
                        *)macroIdentifier,_Var5);
    _Var4._M_current = _Var5._M_current;
    if (bVar1) goto LAB_00120058;
    _Var5._M_current = _Var5._M_current + 1;
  }
  bVar1 = __gnu_cxx::__ops::
          _Iter_pred<ContainsMacro(tcpp::Preprocessor_const&,std::__cxx11::string_const&)::$_0>::
          operator()((_Iter_pred<ContainsMacro(tcpp::Preprocessor_const&,std::__cxx11::string_const&)::__0>
                      *)macroIdentifier,_Var5);
  _Var4._M_current = _Var5._M_current;
  if (!bVar1) {
    _Var4._M_current =
         local_48.super__Vector_base<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
LAB_00120058:
  std::vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>::~vector
            ((vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_> *)&local_48);
  return _Var4._M_current !=
         local_48.super__Vector_base<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>._M_impl.
         super__Vector_impl_data._M_finish;
}

Assistant:

static bool ContainsMacro(const Preprocessor& preprocessor, const std::string& macroIdentifier)
{
	const auto& symTable = preprocessor.GetSymbolsTable();

	auto it = std::find_if(symTable.cbegin(), symTable.cend(), [&macroIdentifier](auto&& symTableEntry)
	{
		return symTableEntry.mName == macroIdentifier;
	});

	return it != symTable.cend();
}